

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsEqualByNameOnly_Test::~Equality_unitsEqualByNameOnly_Test
          (Equality_unitsEqualByNameOnly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualByNameOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("units");
    libcellml::UnitsPtr u2 = libcellml::Units::create("units");

    EXPECT_NE(u1, u2);
    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}